

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> * __thiscall
MlmWrap::getHighFreqList
          (vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *__return_storage_ptr__,
          MlmWrap *this)

{
  mutex *__mutex;
  int iVar1;
  char *__s1;
  byte *s;
  size_t n;
  undefined8 uVar2;
  zmsg_t *msg;
  zframe_t *f;
  HighFreqDataType hf;
  zmsg_t *local_110;
  zframe_t *local_108;
  string local_100;
  binarydata local_e0;
  undefined1 local_c0 [144];
  
  local_110 = czhelp_zmsg_create("s","HFDTSLIST",0);
  __mutex = &this->actormutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    zactor_send(this->actor,&local_110);
    local_110 = zactor_recv(this->actor);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    __s1 = zmsg_popstr(local_110);
    iVar1 = strcmp(__s1,"HFDTSLIST");
    if (iVar1 != 0) {
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,"Error retrieving high freq list\n","");
      error((string *)local_c0,this,&local_100);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)local_c0._0_8_,local_c0._8_8_);
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
    (__return_storage_ptr__->super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108 = zmsg_pop(local_110);
    if (local_108 != (zframe_t *)0x0) {
      do {
        HighFreqDataType::HighFreqDataType((HighFreqDataType *)local_c0);
        s = zframe_data(local_108);
        n = zframe_size(local_108);
        binarydata::binarydata(&local_e0,(char *)s,n);
        HighFreqDataType::decode((HighFreqDataType *)local_c0,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.str._M_dataplus._M_p != &local_e0.str.field_2) {
          operator_delete(local_e0.str._M_dataplus._M_p,
                          local_e0.str.field_2._M_allocated_capacity + 1);
        }
        std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::push_back
                  (__return_storage_ptr__,(HighFreqDataType *)local_c0);
        zframe_destroy(&local_108);
        local_108 = zmsg_pop(local_110);
        HighFreqDataType::~HighFreqDataType((HighFreqDataType *)local_c0);
      } while (local_108 != (zframe_t *)0x0);
    }
    zmsg_destroy(&local_110);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_system_error(iVar1);
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  if ((mutex *)local_100._M_dataplus._M_p != __mutex) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

std::vector<HighFreqDataType> MlmWrap::getHighFreqList(){
    zmsg_t *msg = czhelp_zmsg_create("s", hfdtslist, NULL);
    {
        std::lock_guard<std::mutex> lock(actormutex);
        zactor_send(actor, &msg);
        msg = zactor_recv(actor);
    }
    char* first = zmsg_popstr(msg);
    if(!streq(first, hfdtslist)){
        std::cerr << error("Error retrieving high freq list\n");
    }
    std::vector<HighFreqDataType> hfdts;
    zframe_t *f = zmsg_pop(msg);
    while(f){
        HighFreqDataType hf;
        hf.decode(binarydata((char*)zframe_data(f), zframe_size(f)));
        hfdts.push_back(hf);
        zframe_destroy(&f);
        f = zmsg_pop(msg);
    }
    zmsg_destroy(&msg);
    return hfdts;
}